

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# exomizer.h
# Opt level: O0

uchar * Exomizer_crunch(uchar *input_data,int input_len,int *retlen)

{
  bool bVar1;
  bool bVar2;
  uint flag_char;
  int iVar3;
  char **argv_00;
  char *pcVar4;
  uchar *__dest;
  void *__src;
  crunch_info local_c8;
  crunch_info info [1];
  char *appl;
  membuf outbuf [1];
  membuf inbuf [1];
  common_flags flags [1];
  uchar *output_data;
  char **infilev;
  int infilec;
  int c;
  int reverse_mode;
  int backwards_mode;
  int decrunch_mode;
  char flags_arr [32];
  char **argv;
  int argc;
  int *retlen_local;
  int input_len_local;
  uchar *input_data_local;
  
  bVar1 = false;
  bVar2 = false;
  inbuf[0]._8_8_ = Exomizer_crunch::options;
  argv_00 = (char **)malloc(8);
  pcVar4 = strdup("mem_exomizer");
  *argv_00 = pcVar4;
  info[0] = (crunch_info)fixup_appl(*argv_00);
  G_log_ctx = log_new();
  log_set_level(G_log_ctx,LOG_NORMAL);
  G_log_level = LOG_NORMAL;
  log_add_output_stream(G_log_ctx,LOG_WARNING,LOG_MAX,(log_formatter_f *)0x0,_stdout);
  log_add_output_stream(G_log_ctx,LOG_MIN,~LOG_TRACE,(log_formatter_f *)0x0,_stderr);
  if (~LOG_FATAL < G_log_level) {
    G_log_log_level = LOG_DUMP;
    log_log_default("flagind %d\n",(ulong)(uint)flagind);
  }
  sprintf((char *)&backwards_mode,"bdr%s","cCe:m:M:p:o:qv");
  while (flag_char = getflag(1,argv_00,(char *)&backwards_mode), flag_char != 0xffffffff) {
    if (~LOG_FATAL < G_log_level) {
      G_log_log_level = LOG_DUMP;
      log_log_default(" flagind %d flagopt \'%c\'\n",(ulong)(uint)flagind,(ulong)flag_char);
    }
    if (flag_char == 0x62) {
      bVar1 = true;
    }
    else if (flag_char == 0x72) {
      bVar2 = true;
    }
    else {
      handle_crunch_flags(flag_char,flagarg,print_usage,(char *)info[0],
                          (common_flags *)&inbuf[0].len);
    }
  }
  membuf_init((membuf *)&outbuf[0].len);
  membuf_init((membuf *)&appl);
  membuf_append((membuf *)&outbuf[0].len,input_data,input_len);
  if (bVar1) {
    crunch_backwards((membuf *)&outbuf[0].len,(membuf *)&appl,Exomizer_crunch::options,&local_c8);
  }
  else {
    crunch((membuf *)&outbuf[0].len,(membuf *)&appl,Exomizer_crunch::options,&local_c8);
  }
  if (bVar2) {
    pcVar4 = (char *)membuf_get((membuf *)&appl);
    iVar3 = membuf_memlen((membuf *)&appl);
    reverse_buffer(pcVar4,iVar3);
  }
  iVar3 = membuf_memlen((membuf *)&appl);
  __dest = (uchar *)malloc((long)iVar3);
  __src = membuf_get((membuf *)&appl);
  iVar3 = membuf_memlen((membuf *)&appl);
  memcpy(__dest,__src,(long)iVar3);
  iVar3 = membuf_memlen((membuf *)&appl);
  *retlen = iVar3;
  membuf_free((membuf *)&appl);
  membuf_free((membuf *)&outbuf[0].len);
  log_delete(G_log_ctx);
  return __dest;
}

Assistant:

unsigned char *Exomizer_crunch(unsigned char *input_data, int input_len, int *retlen)
{
	int argc=1;
	char **argv=NULL;
    char flags_arr[32];
    int decrunch_mode = 0;
    int backwards_mode = 0;
    int reverse_mode = 0;
    int c, infilec;
    char **infilev;
	/* output buffer */
	unsigned char *output_data;

    static struct crunch_options options[1] = { CRUNCH_OPTIONS_DEFAULT };
    struct common_flags flags[1] = { {options, DEFAULT_OUTFILE} };

    struct membuf inbuf[1];
    struct membuf outbuf[1];

    const char *appl;;


	argv=malloc(sizeof(char *));
	argv[0]=strdup("mem_exomizer");
    /* init args */
    appl = fixup_appl(argv[0]);

    /* init logging */
    LOG_INIT_CONSOLE(LOG_NORMAL);

    LOG(LOG_DUMP, ("flagind %d\n", flagind));
    sprintf(flags_arr, "bdr%s", CRUNCH_FLAGS);
    while ((c = getflag(argc, argv, flags_arr)) != -1)
    {
        LOG(LOG_DUMP, (" flagind %d flagopt '%c'\n", flagind, c));
        switch (c)
        {
        case 'b':
            backwards_mode = 1;
            break;
        case 'r':
            reverse_mode = 1;
            break;
        default:
            handle_crunch_flags(c, flagarg, print_usage, appl, flags);
        }
    }

    infilev = argv + flagind;
    infilec = argc - flagind;

	/* only memory */
    if (0) if (infilec != 1)
    {
        LOG(LOG_ERROR, ("Error: exactly one input file must be given.\n"));
        print_usage(appl, LOG_NORMAL, DEFAULT_OUTFILE);
        exit(-1);
    }

    membuf_init(inbuf);
    membuf_init(outbuf);

	/* rustine */
    //read_file(infilev[0], inbuf);
	//void read_file(const char *name, struct membuf *buf)
#if 0
	{
    char block[1024];
    FILE *in;
    int len;

    in = fopen(name, "rb");
    if(in == NULL)
    {
        LOG(LOG_ERROR, ("Can't open file \"%s\" for input.\n", name));
        exit(-1);
    }
    do
    {
        len = fread(block, 1, 1024, in);
        membuf_append(buf, block, len);
    }
    while(len == 1024);
    LOG(LOG_DEBUG, ("read %d bytes from file\n", len));
    fclose(in);
	}
#endif
	
	membuf_append(inbuf, input_data, input_len);
	
	
    {
        struct crunch_info info[1];
        if(backwards_mode)
        {
            //JLOG(LOG_NORMAL, ("Crunching infile \"%s\" to outfile \"%s\" " "backwards.\n", infilev[0], flags->outfile));
            crunch_backwards(inbuf, outbuf, options, info);
        }
        else
        {
            //LOG(LOG_NORMAL, ("Crunching infile \"%s\" to outfile \"%s\".\n", infilev[0], flags->outfile));
            crunch(inbuf, outbuf, options, info);
        }

        //LOG(LOG_NORMAL, (" Literal sequences are %sused and", info->literal_sequences_used ? "" : "not "));
        //LOG(LOG_NORMAL, ("Mizoumizer info: the safety offset is %d.\n", info->needed_safety_offset));

    }

    if(reverse_mode)
    {
        reverse_buffer(membuf_get(outbuf), membuf_memlen(outbuf));
    }
	
#if 0	
    //write_file(flags->outfile, outbuf);
	//void write_file(const char *name, struct membuf *buf)
	{
    FILE *out;
    out = fopen(flags->outfile, "wb");
    if(out == NULL)
    {
        LOG(LOG_ERROR, ("Can't open file \"%s\" for output.\n", name));
        exit(-1);
    }
    fwrite(, 1, membuf_memlen(outbuf), out);
    fclose(out);
	}
#endif

	output_data=MemMalloc(membuf_memlen(outbuf));
	memcpy(output_data,membuf_get(outbuf),membuf_memlen(outbuf));
	*retlen=membuf_memlen(outbuf);
	
    membuf_free(outbuf);
    membuf_free(inbuf);

    LOG_FREE;

    return output_data;
}